

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_resolver_util_test.cc
# Opt level: O3

void __thiscall
google::protobuf::util::anon_unknown_0::DescriptorPoolTypeResolverTest_TestCustomFieldOptions_Test::
TestBody(DescriptorPoolTypeResolverTest_TestCustomFieldOptions_Test *this)

{
  TypeResolver *pTVar1;
  Field *pFVar2;
  Type *value;
  char *in_R9;
  pointer *__ptr;
  string_view name;
  string_view name_00;
  Type type;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_d8;
  AssertHelper local_d0;
  internal local_c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0;
  string local_b8;
  Type local_98;
  
  Type::Type(&local_98,(Arena *)0x0);
  pTVar1 = (this->super_DescriptorPoolTypeResolverTest).resolver_._M_t.
           super___uniq_ptr_impl<google::protobuf::util::TypeResolver,_std::default_delete<google::protobuf::util::TypeResolver>_>
           ._M_t.
           super__Tuple_impl<0UL,_google::protobuf::util::TypeResolver_*,_std::default_delete<google::protobuf::util::TypeResolver>_>
           .super__Head_base<0UL,_google::protobuf::util::TypeResolver_*,_false>._M_head_impl;
  GetTypeUrl<proto2_unittest::TestMessageWithCustomOptions>();
  value = &local_98;
  (*pTVar1->_vptr_TypeResolver[2])(&local_d8,pTVar1,&local_b8);
  local_c8[0] = (internal)((StatusRep *)local_d8._M_head_impl == (StatusRep *)0x1);
  local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (((ulong)local_d8._M_head_impl & 1) == 0) {
    absl::lts_20250127::status_internal::StatusRep::Unref((StatusRep *)local_d8._M_head_impl);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b8,local_c8,
               (AssertionResult *)
               "resolver_ ->ResolveMessageType( GetTypeUrl<proto2_unittest::TestMessageWithCustomOptions>(), &type) .ok()"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
               ,0x166,local_b8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_d8);
  }
  else {
    if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_c0,local_c0);
    }
    name_00._M_str = (char *)value;
    name_00._M_len = (size_t)"field1";
    pFVar2 = FindField((anon_unknown_0 *)&local_98,(Type *)&DAT_00000006,name_00);
    local_c8[0] = (internal)(pFVar2 != (Field *)0x0);
    local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (pFVar2 == (Field *)0x0) {
      testing::Message::Message((Message *)&local_d8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_b8,local_c8,(AssertionResult *)0x11835db,"false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_d0,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
                 ,0x168,local_b8._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_d8);
    }
    else {
      name._M_str = "proto2_unittest.field_opt1";
      name._M_len = 0x1a;
      local_c8[0] = (internal)
                    HasUInt64Option(&(pFVar2->field_0)._impl_.options_,name,(uint64_t)value);
      local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if ((bool)local_c8[0]) goto LAB_00bb6219;
      testing::Message::Message((Message *)&local_d8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_b8,local_c8,
                 (AssertionResult *)
                 "HasUInt64Option(field->options(), \"proto2_unittest.field_opt1\", 8765432109)",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
                 ,0x16a,local_b8._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_d8);
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((StatusRep *)local_d8._M_head_impl != (StatusRep *)0x0) {
    (**(code **)(*(long *)local_d8._M_head_impl + 8))();
  }
  if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,local_c0);
  }
LAB_00bb6219:
  Type::~Type(&local_98);
  return;
}

Assistant:

TEST_F(DescriptorPoolTypeResolverTest, TestCustomFieldOptions) {
  Type type;
  ASSERT_TRUE(
      resolver_
          ->ResolveMessageType(
              GetTypeUrl<proto2_unittest::TestMessageWithCustomOptions>(),
              &type)
          .ok());
  const Field* field = FindField(type, "field1");
  ASSERT_TRUE(field != nullptr);
  EXPECT_TRUE(HasUInt64Option(field->options(), "proto2_unittest.field_opt1",
                              8765432109));
}